

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O2

PCRE2_SPTR8 get_chr_property_list(PCRE2_SPTR8 code,BOOL utf,BOOL ucp,uint8_t *fcc,uint32_t *list)

{
  byte bVar1;
  PCRE2_UCHAR8 PVar2;
  uint uVar3;
  byte bVar4;
  undefined4 in_register_00000014;
  uint *puVar5;
  byte *pbVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  byte *pbVar8;
  
  puVar5 = (uint *)CONCAT44(in_register_00000014,ucp);
  bVar4 = *code;
  uVar3 = (uint)bVar4;
  *puVar5 = (uint)bVar4;
  puVar5[1] = 0;
  pbVar8 = code + 1;
  if (0x40 < (byte)(bVar4 - 0x21)) goto LAB_00179eac;
  PVar2 = get_repeat_base(bVar4);
  bVar4 = (bVar4 - PVar2) + 0x21;
  if ((bVar4 < 0x2e) && ((0x238000000000U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
    pbVar8 = code + 3;
  }
  if ((0x29 < bVar4) || (uVar7 = 0, (0x21800000000U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) {
    uVar7 = (uint)(bVar4 != 0x2b);
  }
  puVar5[1] = uVar7;
  uVar7 = 0x1d;
  if (PVar2 == '!') {
LAB_00179e9d:
    *puVar5 = uVar7;
switchD_00179ec6_caseD_1d:
    pbVar6 = pbVar8 + 1;
    puVar5[2] = (uint)*pbVar8;
    goto LAB_00179ef1;
  }
  if (PVar2 != '.') {
    if (PVar2 == 'U') {
      uVar3 = (uint)*pbVar8;
      *puVar5 = (uint)*pbVar8;
      pbVar8 = pbVar8 + 1;
LAB_00179eac:
      switch(uVar3) {
      case 6:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
        return pbVar8;
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x1b:
      case 0x1c:
        return (PCRE2_SPTR8)0x0;
      case 0x1d:
      case 0x1f:
        goto switchD_00179ec6_caseD_1d;
      case 0x1e:
        uVar7 = 0x1d;
        goto LAB_00179ed7;
      case 0x20:
        goto switchD_00179ec6_caseD_20;
      default:
        if (1 < uVar3 - 0x6e) {
          return (PCRE2_SPTR8)0x0;
        }
        uVar3 = pbVar8[0x20] - 0x62;
        if (uVar3 < 0xc) {
          if ((0x533U >> (uVar3 & 0x1f) & 1) == 0) {
            if ((0x20cU >> (uVar3 & 0x1f) & 1) == 0) {
              puVar5[1] = (uint)((*(ushort *)(pbVar8 + 0x21) & 0xff) == 0 &&
                                *(ushort *)(pbVar8 + 0x21) >> 8 == 0);
              pbVar6 = pbVar8 + 0x25;
              goto LAB_00179f5d;
            }
          }
          else {
            puVar5[1] = 1;
          }
          pbVar6 = pbVar8 + 0x21;
        }
        else {
          pbVar6 = pbVar8 + 0x20;
        }
LAB_00179f5d:
        puVar5[2] = (int)pbVar6 - (int)pbVar8;
        return pbVar6;
      }
    }
    if (PVar2 != 'H') {
      if (PVar2 == ';') {
        uVar7 = 0x1f;
        goto LAB_00179e9d;
      }
      goto LAB_00179eac;
    }
switchD_00179ec6_caseD_20:
    uVar7 = 0x1f;
  }
LAB_00179ed7:
  *puVar5 = uVar7;
  bVar4 = *pbVar8;
  pbVar6 = pbVar8 + 1;
  puVar5[2] = (uint)bVar4;
  bVar1 = *(byte *)(CONCAT44(in_register_00000034,utf) + (ulong)bVar4);
  puVar5[3] = (uint)bVar1;
  if (bVar4 != bVar1) {
    puVar5[4] = 0xffffffff;
    return pbVar6;
  }
LAB_00179ef1:
  puVar5[3] = 0xffffffff;
  return pbVar6;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, BOOL ucp, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warnings */
(void)ucp;
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf && !ucp))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }

return NULL;    /* Opcode not accepted */
}